

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

_Bool prefix_i(char *s,char *t)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  __int32_t *p_Var4;
  __int32_t **pp_Var5;
  long lVar6;
  _Bool _Var7;
  
  bVar3 = *t;
  _Var7 = (ulong)bVar3 == 0;
  if (!_Var7) {
    pp_Var5 = __ctype_toupper_loc();
    p_Var4 = *pp_Var5;
    if (p_Var4[bVar3] == p_Var4[(byte)*s]) {
      lVar6 = 1;
      do {
        pbVar1 = (byte *)(t + lVar6);
        _Var7 = (ulong)*pbVar1 == 0;
        if (_Var7) {
          return _Var7;
        }
        pbVar2 = (byte *)(s + lVar6);
        lVar6 = lVar6 + 1;
      } while (p_Var4[*pbVar1] == p_Var4[*pbVar2]);
    }
  }
  return _Var7;
}

Assistant:

bool prefix_i(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		if (toupper((unsigned char)*t) != toupper((unsigned char)*s))
			return (false);
		else
		{
			t++;
			s++;
		}
	}

	/* Matched, we have a prefix */
	return (true);
}